

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int fs_makedir_recursive(char *path)

{
  char cVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined8 uStack_840;
  char buffer [2048];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_840 = (code *)0x1c0fc6;
  str_copy(buffer,path,0x800);
  uStack_840 = (code *)0x1c0fce;
  sVar5 = strlen(buffer);
  iVar4 = -1;
  for (lVar6 = 1; lVar6 < (int)sVar5; lVar6 = lVar6 + 1) {
    cVar1 = buffer[lVar6];
    if ((cVar1 == '/') || ((cVar1 == '\\' && (buffer[lVar6 + -1] != ':')))) {
      buffer[lVar6] = '\0';
      uStack_840 = (code *)0x1c1003;
      iVar3 = fs_makedir(buffer);
      if (iVar3 < 0) goto LAB_001c101a;
      buffer[lVar6] = cVar1;
    }
  }
  uStack_840 = (code *)0x1c1018;
  iVar4 = fs_makedir(path);
LAB_001c101a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar4;
  }
  uStack_840 = fs_chdir;
  __stack_chk_fail();
}

Assistant:

int fs_makedir_recursive(const char *path)
{
	char buffer[2048];
	int len;
	int i;
	str_copy(buffer, path, sizeof(buffer));
	len = str_length(buffer);
	// ignore a leading slash
	for(i = 1; i < len; i++)
	{
		char b = buffer[i];
		if(b == '/' || (b == '\\' && buffer[i-1] != ':'))
		{
			buffer[i] = 0;
			if(fs_makedir(buffer) < 0)
			{
				return -1;
			}
			buffer[i] = b;

		}
	}
	return fs_makedir(path);
}